

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::copyImageIter(CopyImageTest *this)

{
  ImageInfo *info;
  ImageInfo *info_00;
  deUint32 dVar1;
  TestLog *pTVar2;
  State *pSVar3;
  ObjectWrapper *pOVar4;
  ObjectWrapper *pOVar5;
  pointer pAVar6;
  pointer pAVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer pCVar12;
  byte bVar13;
  int i;
  int iVar14;
  deUint32 dVar15;
  int iVar16;
  undefined4 extraout_var;
  long lVar17;
  int i_25;
  uint uVar18;
  int i_31;
  ulong uVar19;
  uint uVar20;
  ostringstream *this_00;
  int iVar21;
  int iVar22;
  byte bVar23;
  pointer vec;
  bool bVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  Vector<int,_3> res_27;
  IVec3 srcPos;
  IVec3 dstPos;
  IVec3 srcBlockPos;
  IVec3 srcCopySize;
  IVec3 dstCopySize;
  IVec3 dstBlockPos;
  IVec3 srcBlockPixelSize;
  IVec3 dstSize;
  IVec3 dstCompleteBlockSize;
  IVec3 dstBlockPixelSize;
  IVec3 srcSize;
  pointer local_268;
  IVec3 maxCopyBlockSize;
  IVec3 srcCompleteBlockSize;
  int local_218;
  int iStack_214;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  copies;
  Vector<int,_3> res_13;
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pSVar3 = this->m_state;
  pOVar4 = pSVar3->srcImage;
  pOVar5 = pSVar3->dstImage;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info = &this->m_srcImageInfo;
  info_00 = &this->m_dstImageInfo;
  dVar15 = (this->m_srcImageInfo).m_target;
  dVar1 = (this->m_dstImageInfo).m_target;
  getTexelBlockPixelSize((anon_unknown_0 *)&srcBlockPixelSize,(this->m_srcImageInfo).m_format);
  getTexelBlockPixelSize((anon_unknown_0 *)&dstBlockPixelSize,(this->m_dstImageInfo).m_format);
  uVar19 = 0;
  do {
    bVar23 = 0;
    if (dVar15 == 0x8d41) {
LAB_016627c3:
      if (dVar1 == 0x8d41) goto LAB_01662812;
      if (uVar19 < 2) {
        bVar13 = (byte)(&DAT_01c92628)[uVar19];
      }
      else {
LAB_01662800:
        iVar21 = getLastFullLevel(info_00);
        bVar13 = (byte)iVar21;
      }
    }
    else {
      if (uVar19 < 2) {
        bVar23 = (byte)(&DAT_01c92628)[uVar19];
        goto LAB_016627c3;
      }
      iVar21 = getLastFullLevel(info);
      bVar23 = (byte)iVar21;
      if (dVar1 != 0x8d41) goto LAB_01662800;
LAB_01662812:
      bVar13 = 0;
    }
    srcSize.m_data[2] = 0;
    srcSize.m_data[0] = 0;
    srcSize.m_data[1] = 0;
    if ((this->m_srcImageInfo).m_target == 0x8c1a) {
      srcSize.m_data[0] = (this->m_srcImageInfo).m_size.m_data[0] >> (bVar23 & 0x1f);
      if (srcSize.m_data[0] < 2) {
        srcSize.m_data[0] = 1;
      }
      srcSize.m_data[1] = (this->m_srcImageInfo).m_size.m_data[1] >> (bVar23 & 0x1f);
      if (srcSize.m_data[1] < 2) {
        srcSize.m_data[1] = 1;
      }
      srcSize.m_data[2] = (this->m_srcImageInfo).m_size.m_data[2];
    }
    else {
      lVar17 = 0;
      do {
        iVar21 = (this->m_srcImageInfo).m_size.m_data[lVar17] >> (bVar23 & 0x1f);
        if (iVar21 < 2) {
          iVar21 = 1;
        }
        srcSize.m_data[lVar17] = iVar21;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
    }
    dstSize.m_data[2] = 0;
    dstSize.m_data[0] = 0;
    dstSize.m_data[1] = 0;
    if ((this->m_dstImageInfo).m_target == 0x8c1a) {
      dstSize.m_data[0] = (this->m_dstImageInfo).m_size.m_data[0] >> (bVar13 & 0x1f);
      if (dstSize.m_data[0] < 2) {
        dstSize.m_data[0] = 1;
      }
      dstSize.m_data[1] = (this->m_dstImageInfo).m_size.m_data[1] >> (bVar13 & 0x1f);
      if (dstSize.m_data[1] < 2) {
        dstSize.m_data[1] = 1;
      }
      dstSize.m_data[2] = (this->m_dstImageInfo).m_size.m_data[2];
    }
    else {
      lVar17 = 0;
      do {
        iVar21 = (this->m_dstImageInfo).m_size.m_data[lVar17] >> (bVar13 & 0x1f);
        if (iVar21 < 2) {
          iVar21 = 1;
        }
        dstSize.m_data[lVar17] = iVar21;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
    }
    dstCompleteBlockSize.m_data[2] = 6;
    srcCompleteBlockSize.m_data[2] = 6;
    if (dVar15 != 0x8513) {
      srcCompleteBlockSize.m_data[2] = srcSize.m_data[2] / srcBlockPixelSize.m_data[2];
    }
    srcCompleteBlockSize.m_data[0] = srcSize.m_data[0] / srcBlockPixelSize.m_data[0];
    srcCompleteBlockSize.m_data[1] = srcSize.m_data[1] / srcBlockPixelSize.m_data[1];
    if (dVar1 != 0x8513) {
      dstCompleteBlockSize.m_data[2] = dstSize.m_data[2] / dstBlockPixelSize.m_data[2];
    }
    dstCompleteBlockSize.m_data[1] = dstSize.m_data[1] / dstBlockPixelSize.m_data[1];
    dstCompleteBlockSize.m_data[0] = dstSize.m_data[0] / dstBlockPixelSize.m_data[0];
    maxCopyBlockSize.m_data[2] = 0;
    maxCopyBlockSize.m_data[0] = 0;
    maxCopyBlockSize.m_data[1] = 0;
    lVar17 = 0;
    do {
      iVar21 = dstCompleteBlockSize.m_data[lVar17];
      if (srcCompleteBlockSize.m_data[lVar17] < dstCompleteBlockSize.m_data[lVar17]) {
        iVar21 = srcCompleteBlockSize.m_data[lVar17];
      }
      maxCopyBlockSize.m_data[lVar17] = iVar21;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    uVar18 = ((int)(((uint)(maxCopyBlockSize.m_data[0] >> 0x1f) >> 0x1e) +
                   maxCopyBlockSize.m_data[0]) >> 2) * 2;
    uVar20 = ((int)(((uint)(maxCopyBlockSize.m_data[1] >> 0x1f) >> 0x1e) +
                   maxCopyBlockSize.m_data[1]) >> 2) * 2;
    uVar25 = -(uint)(2 < (int)uVar18);
    uVar27 = -(uint)(2 < (int)uVar20);
    iVar21 = maxCopyBlockSize.m_data[2] + 3;
    if (-1 < maxCopyBlockSize.m_data[2]) {
      iVar21 = maxCopyBlockSize.m_data[2];
    }
    iVar26 = (~uVar25 & 2 | uVar18 & uVar25) - 1;
    iVar28 = (~uVar27 & 2 | uVar20 & uVar27) - 1;
    iVar21 = (iVar21 >> 2) * 2;
    if (iVar21 < 3) {
      iVar21 = 2;
    }
    iVar21 = iVar21 + -1;
    res_27.m_data[1] = iVar28;
    res_27.m_data[0] = iVar26;
    res_27.m_data[2] = iVar21;
    srcBlockPos.m_data[2] = 0;
    srcBlockPos.m_data[0] = 0;
    srcBlockPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      srcBlockPos.m_data[lVar17] = srcCompleteBlockSize.m_data[lVar17] - res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    dstBlockPos.m_data[2] = 0;
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      srcPos.m_data[lVar17] = srcBlockPixelSize.m_data[lVar17] * srcBlockPos.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      dstPos.m_data[lVar17] = dstBlockPixelSize.m_data[lVar17] * dstBlockPos.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    srcCopySize.m_data[2] = 0;
    srcCopySize.m_data[0] = 0;
    srcCopySize.m_data[1] = 0;
    lVar17 = 0;
    do {
      srcCopySize.m_data[lVar17] = srcBlockPixelSize.m_data[lVar17] * res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstCopySize.m_data[2] = 0;
    dstCopySize.m_data[0] = 0;
    dstCopySize.m_data[1] = 0;
    lVar17 = 0;
    do {
      dstCopySize.m_data[lVar17] = dstBlockPixelSize.m_data[lVar17] * res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    res_13.m_data[2] = srcPos.m_data[2];
    res_13.m_data[0] = srcPos.m_data[0];
    res_13.m_data[1] = srcPos.m_data[1];
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(value_type *)&res_13);
    res_27.m_data[2] = iVar21;
    srcBlockPos.m_data[0] = 0;
    srcBlockPos.m_data[1] = 0;
    srcBlockPos.m_data[2] = 0;
    dstBlockPos.m_data[2] = 0;
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      dstBlockPos.m_data[lVar17] = dstCompleteBlockSize.m_data[lVar17] - res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      srcPos.m_data[lVar17] = srcBlockPixelSize.m_data[lVar17] * srcBlockPos.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      dstPos.m_data[lVar17] = dstBlockPixelSize.m_data[lVar17] * dstBlockPos.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    srcCopySize.m_data[2] = 0;
    srcCopySize.m_data[0] = 0;
    srcCopySize.m_data[1] = 0;
    lVar17 = 0;
    do {
      srcCopySize.m_data[lVar17] = srcBlockPixelSize.m_data[lVar17] * res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstCopySize.m_data[2] = 0;
    dstCopySize.m_data[0] = 0;
    dstCopySize.m_data[1] = 0;
    lVar17 = 0;
    do {
      dstCopySize.m_data[lVar17] = dstBlockPixelSize.m_data[lVar17] * res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    res_13.m_data[2] = srcPos.m_data[2];
    res_13.m_data[0] = srcPos.m_data[0];
    res_13.m_data[1] = srcPos.m_data[1];
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(value_type *)&res_13);
    res_27.m_data[2] = iVar21;
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      iVar21 = srcCompleteBlockSize.m_data[lVar17];
      iVar26 = iVar21 + 3;
      if (-1 < iVar21) {
        iVar26 = iVar21;
      }
      srcPos.m_data[lVar17] = iVar26 >> 2;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstBlockPos.m_data[2] = 0;
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      dstBlockPos.m_data[lVar17] = srcPos.m_data[lVar17] << 2;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    res_13.m_data[2] = 0;
    res_13.m_data[0] = 0;
    res_13.m_data[1] = 0;
    lVar17 = 0;
    do {
      res_13.m_data[lVar17] = dstBlockPos.m_data[lVar17] - res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    srcBlockPos.m_data[2] = 0;
    srcBlockPos.m_data[0] = 0;
    srcBlockPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      iVar21 = dstPos.m_data[lVar17];
      if (dstPos.m_data[lVar17] < res_13.m_data[lVar17]) {
        iVar21 = res_13.m_data[lVar17];
      }
      srcBlockPos.m_data[lVar17] = iVar21;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      iVar21 = dstCompleteBlockSize.m_data[lVar17];
      iVar26 = iVar21 + 3;
      if (-1 < iVar21) {
        iVar26 = iVar21;
      }
      dstPos.m_data[lVar17] = iVar26 >> 2;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      srcPos.m_data[lVar17] = dstPos.m_data[lVar17] << 2;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    res_13.m_data[2] = 0;
    res_13.m_data[0] = 0;
    res_13.m_data[1] = 0;
    lVar17 = 0;
    do {
      res_13.m_data[lVar17] = srcPos.m_data[lVar17] - res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    srcCopySize.m_data[2] = 0;
    srcCopySize.m_data[0] = 0;
    srcCopySize.m_data[1] = 0;
    dstBlockPos.m_data[2] = 0;
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      iVar21 = srcCopySize.m_data[lVar17];
      if (srcCopySize.m_data[lVar17] < res_13.m_data[lVar17]) {
        iVar21 = res_13.m_data[lVar17];
      }
      dstBlockPos.m_data[lVar17] = iVar21;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      srcPos.m_data[lVar17] = srcBlockPixelSize.m_data[lVar17] * srcBlockPos.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    lVar17 = 0;
    do {
      dstPos.m_data[lVar17] = dstBlockPixelSize.m_data[lVar17] * dstBlockPos.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    srcCopySize.m_data[2] = 0;
    srcCopySize.m_data[0] = 0;
    srcCopySize.m_data[1] = 0;
    lVar17 = 0;
    do {
      srcCopySize.m_data[lVar17] = srcBlockPixelSize.m_data[lVar17] * res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    dstCopySize.m_data[2] = 0;
    dstCopySize.m_data[0] = 0;
    dstCopySize.m_data[1] = 0;
    lVar17 = 0;
    do {
      dstCopySize.m_data[lVar17] = dstBlockPixelSize.m_data[lVar17] * res_27.m_data[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    res_13.m_data[2] = srcPos.m_data[2];
    res_13.m_data[0] = srcPos.m_data[0];
    res_13.m_data[1] = srcPos.m_data[1];
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(value_type *)&res_13);
    bVar24 = 1 < uVar19;
    uVar19 = uVar19 + 1;
    if (dVar1 == 0x8d41 && dVar15 == 0x8d41 || bVar24) {
      pCVar12 = copies.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (int)((long)copies.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)copies.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
      if (0 < (int)uVar18) {
        local_268 = copies.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        uVar19 = 0;
        do {
          this_00 = (ostringstream *)(res_13.m_data + 2);
          res_13.m_data._0_8_ = pTVar2;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Copying area with size ",0x17);
          vec = pCVar12 + uVar19;
          tcu::operator<<((ostream *)this_00,&vec->size);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," from source image position ",0x1c);
          tcu::operator<<((ostream *)this_00,&vec->srcPos);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," and mipmap level ",0x12);
          std::ostream::operator<<(this_00,vec->srcLevel);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," to destination image position ",0x1f);
          tcu::operator<<((ostream *)this_00,&vec->dstPos);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," and mipmap level ",0x12);
          std::ostream::operator<<(this_00,vec->dstLevel);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Size in destination format is ",0x1e);
          tcu::operator<<((ostream *)this_00,&vec->dstSize);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&res_13,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_138);
          iVar21 = vec->dstLevel;
          iVar26 = vec->srcLevel;
          (**(code **)(CONCAT44(extraout_var,iVar14) + 0x310))
                    (pOVar4->m_object,(this->m_srcImageInfo).m_target,iVar26,(vec->srcPos).m_data[0]
                     ,(vec->srcPos).m_data[1],(vec->srcPos).m_data[2],pOVar5->m_object,
                     (this->m_dstImageInfo).m_target,(long)iVar21,(vec->dstPos).m_data[0],
                     (vec->dstPos).m_data[1],(vec->dstPos).m_data[2],(vec->size).m_data[0],
                     (vec->size).m_data[1],(vec->size).m_data[2]);
          dVar15 = (**(code **)(CONCAT44(extraout_var,iVar14) + 0x800))();
          glu::checkError(dVar15,"glCopyImageSubData failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                          ,0x460);
          pAVar6 = (pSVar3->srcImageLevels).
                   super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar7 = (pSVar3->dstImageLevels).
                   super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          getTexelBlockPixelSize((anon_unknown_0 *)&res_13,info->m_format);
          iVar28 = getTexelBlockSize(info->m_format);
          srcBlockPixelSize.m_data[2] = 0;
          srcBlockPixelSize.m_data[0] = 0;
          srcBlockPixelSize.m_data[1] = 0;
          lVar17 = 0;
          do {
            srcBlockPixelSize.m_data[lVar17] =
                 (local_268->srcPos).m_data[lVar17] / res_13.m_data[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          getTexelBlockStride((anon_unknown_0 *)&dstBlockPixelSize,info,iVar26);
          getTexelBlockPixelSize((anon_unknown_0 *)&srcSize,info_00->m_format);
          getTexelBlockSize(info_00->m_format);
          dstSize.m_data[2] = 0;
          dstSize.m_data[0] = 0;
          dstSize.m_data[1] = 0;
          lVar17 = 0;
          do {
            dstSize.m_data[lVar17] = (local_268->dstPos).m_data[lVar17] / srcSize.m_data[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          getTexelBlockStride((anon_unknown_0 *)&srcCompleteBlockSize,info_00,iVar21);
          dstCompleteBlockSize.m_data[2] = 0;
          dstCompleteBlockSize.m_data[0] = 0;
          dstCompleteBlockSize.m_data[1] = 0;
          lVar17 = 0;
          do {
            dstCompleteBlockSize.m_data[lVar17] =
                 (local_268->size).m_data[lVar17] / res_13.m_data[lVar17];
            iVar11 = dstCompleteBlockSize.m_data[2];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          if (0 < dstCompleteBlockSize.m_data[2]) {
            iVar10 = dstCompleteBlockSize.m_data[1];
            iVar28 = iVar28 * dstCompleteBlockSize.m_data[0];
            iVar22 = 0;
            do {
              if (0 < iVar10) {
                uVar20 = 0;
                do {
                  maxCopyBlockSize.m_data._0_8_ = (ulong)uVar20 << 0x20;
                  maxCopyBlockSize.m_data[2] = iVar22;
                  srcBlockPos.m_data[2] = 0;
                  srcBlockPos.m_data[0] = 0;
                  srcBlockPos.m_data[1] = 0;
                  lVar17 = 0;
                  do {
                    srcBlockPos.m_data[lVar17] =
                         maxCopyBlockSize.m_data[lVar17] + srcBlockPixelSize.m_data[lVar17];
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  res_27.m_data[2] = 0;
                  res_27.m_data[0] = 0;
                  res_27.m_data[1] = 0;
                  lVar17 = 0;
                  do {
                    res_27.m_data[lVar17] =
                         dstBlockPixelSize.m_data[lVar17] * srcBlockPos.m_data[lVar17];
                    iVar9 = res_27.m_data[2];
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  pvVar8 = pAVar6[iVar26].m_ptr;
                  srcBlockPos.m_data[2] = 0;
                  srcBlockPos.m_data[0] = 0;
                  srcBlockPos.m_data[1] = 0;
                  lVar17 = 0;
                  do {
                    srcBlockPos.m_data[lVar17] =
                         maxCopyBlockSize.m_data[lVar17] + dstSize.m_data[lVar17];
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  iVar16 = res_27.m_data[1] + res_27.m_data[0];
                  res_27.m_data[2] = 0;
                  res_27.m_data[0] = 0;
                  res_27.m_data[1] = 0;
                  lVar17 = 0;
                  do {
                    res_27.m_data[lVar17] =
                         srcCompleteBlockSize.m_data[lVar17] * srcBlockPos.m_data[lVar17];
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  memcpy((void *)((long)(res_27.m_data[1] + res_27.m_data[0] + res_27.m_data[2]) +
                                 (long)pAVar7[iVar21].m_ptr),
                         (void *)((long)pvVar8 + (long)(iVar16 + iVar9)),(long)iVar28);
                  uVar20 = uVar20 + 1;
                } while (uVar20 != iVar10);
              }
              iVar22 = iVar22 + 1;
            } while (iVar22 != iVar11);
          }
          uVar19 = uVar19 + 1;
          local_268 = local_268 + 1;
        } while (uVar19 != (uVar18 & 0x7fffffff));
      }
      if (pCVar12 != (pointer)0x0) {
        operator_delete(pCVar12,(long)copies.
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pCVar12);
      }
      return;
    }
  } while( true );
}

Assistant:

void CopyImageTest::copyImageIter (void)
{
	TestLog&						log				= m_testCtx.getLog();
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	glu::ObjectWrapper&				srcImage		= *m_state->srcImage;
	glu::ObjectWrapper&				dstImage		= *m_state->dstImage;

	vector<ArrayBuffer<deUint8> >&	srcImageLevels	= m_state->srcImageLevels;
	vector<ArrayBuffer<deUint8> >&	dstImageLevels	= m_state->dstImageLevels;
	vector<Copy>					copies;

	generateCopies(copies, m_srcImageInfo, m_dstImageInfo);

	for (int copyNdx = 0; copyNdx < (int)copies.size(); copyNdx++)
	{
		const Copy& copy = copies[copyNdx];

		log	<< TestLog::Message
			<< "Copying area with size " << copy.size
			<< " from source image position " << copy.srcPos << " and mipmap level " << copy.srcLevel
			<< " to destination image position " << copy.dstPos << " and mipmap level " << copy.dstLevel << ". "
			<< "Size in destination format is " << copy.dstSize
			<< TestLog::EndMessage;

		copyImage(gl, *dstImage, dstImageLevels, m_dstImageInfo, copy.dstLevel, copy.dstPos,
					  *srcImage, srcImageLevels, m_srcImageInfo, copy.srcLevel, copy.srcPos, copy.size);
	}
}